

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O3

BaseType spirv_cross::to_signed_basetype(uint32_t width)

{
  uint uVar1;
  runtime_error *this;
  uint uVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar1 = width - 8 >> 3;
  uVar2 = width << 0x1d | uVar1;
  if ((uVar2 < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(BaseType *)(&DAT_00346024 + (ulong)uVar2 * 4);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Invalid bit width.","");
  ::std::runtime_error::runtime_error(this,(string *)local_40);
  *(undefined ***)this = &PTR__runtime_error_003d4e98;
  __cxa_throw(this,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline SPIRType::BaseType to_signed_basetype(uint32_t width)
{
	switch (width)
	{
	case 8:
		return SPIRType::SByte;
	case 16:
		return SPIRType::Short;
	case 32:
		return SPIRType::Int;
	case 64:
		return SPIRType::Int64;
	default:
		SPIRV_CROSS_THROW("Invalid bit width.");
	}
}